

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData160 * cfd::core::HashUtil::Ripemd160(ByteData160 *__return_storage_ptr__,ByteData *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  ByteData *local_18;
  ByteData *data_local;
  
  local_18 = data;
  data_local = (ByteData *)__return_storage_ptr__;
  ByteData::GetBytes(&local_30,data);
  Ripemd160(__return_storage_ptr__,&local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffffc0);
  return __return_storage_ptr__;
}

Assistant:

ByteData160 HashUtil::Ripemd160(const ByteData &data) {
  return Ripemd160(data.GetBytes());
}